

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_parse_invalid_value(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  int j;
  int i;
  char *args [5];
  cargo_t local_48;
  undefined1 local_40 [4];
  undefined1 local_3c [4];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  
  iVar1 = cargo_init(&local_48,0,"program");
  if (iVar1 == 0) {
    local_18 = "a";
    local_28 = "1";
    pcStack_20 = "--beta";
    local_38 = 0x12aaaa;
    uStack_34 = 0;
    uStack_30 = 0x127dbd;
    uStack_2c = 0;
    cargo_add_option(local_48,0,"--alpha -a","The alpha","i",local_3c);
    iVar1 = cargo_add_option(local_48,0,"--beta -b","The beta","i",local_40);
    if (iVar1 == 0) {
      pcVar2 = (char *)0x0;
      iVar1 = cargo_parse(local_48,0,1,5,(char **)&local_38);
      if (iVar1 == 0) {
        pcVar2 = "Succesfully parsed invalid value";
      }
    }
    else {
      pcVar2 = "Failed to add options";
    }
    cargo_destroy(&local_48);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_parse_invalid_value)
{
    int i;
    int j;
    char *args[] = { "program", "--alpha", "1", "--beta", "a" };

    ret = cargo_add_option(cargo, 0, "--alpha -a", "The alpha", "i", &i);
    ret = cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &j);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret != 0, "Succesfully parsed invalid value");

    _TEST_CLEANUP();
}